

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O3

int anon_unknown.dwarf_254152::verify_state(snd_pcm_t *handle)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  
  iVar1 = (*(anonymous_namespace)::psnd_pcm_state)();
  if (iVar1 == 8) {
    iVar1 = -0x13;
  }
  else {
    if (iVar1 == 7) {
      uVar3 = 0xffffffaa;
    }
    else {
      if (iVar1 != 4) {
        return iVar1;
      }
      uVar3 = 0xffffffe0;
    }
    iVar2 = (*(anonymous_namespace)::psnd_pcm_recover)(handle,uVar3,1);
    if (iVar2 < 0) {
      iVar1 = iVar2;
    }
  }
  return iVar1;
}

Assistant:

int verify_state(snd_pcm_t *handle)
{
    snd_pcm_state_t state{snd_pcm_state(handle)};

    int err;
    switch(state)
    {
        case SND_PCM_STATE_OPEN:
        case SND_PCM_STATE_SETUP:
        case SND_PCM_STATE_PREPARED:
        case SND_PCM_STATE_RUNNING:
        case SND_PCM_STATE_DRAINING:
        case SND_PCM_STATE_PAUSED:
            /* All Okay */
            break;

        case SND_PCM_STATE_XRUN:
            if((err=snd_pcm_recover(handle, -EPIPE, 1)) < 0)
                return err;
            break;
        case SND_PCM_STATE_SUSPENDED:
            if((err=snd_pcm_recover(handle, -ESTRPIPE, 1)) < 0)
                return err;
            break;
        case SND_PCM_STATE_DISCONNECTED:
            return -ENODEV;
    }

    return state;
}